

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::stringstream_parser<double>(string *text,double *value)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  long local_1a0;
  stringstream in;
  double *value_local;
  string *text_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0,(string *)text,_Var2);
  std::istream::operator>>((istream *)&local_1a0,value);
  bVar1 = std::ios::operator!((ios *)((long)&local_1a0 + *(long *)(local_1a0 + -0x18)));
  if ((bVar1 & 1) != 0) {
    throw_or_mimic<cxxopts::argument_incorrect_type>(text);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  return;
}

Assistant:

void stringstream_parser(const std::string& text, T& value)
    {
      std::stringstream in(text);
      in >> value;
      if (!in) {
        throw_or_mimic<argument_incorrect_type>(text);
      }
    }